

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar3;
  byte bVar4;
  BVH *bvh;
  size_t sVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vbool<4> vVar24;
  char cVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  size_t mask;
  ulong uVar29;
  ulong uVar30;
  undefined4 uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  NodeRef root;
  NodeRef *pNVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar37 [64];
  vint4 bi_13;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai_2;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_3;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar76;
  float fVar77;
  vint4 bi;
  float fVar78;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi_1;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vint4 bi_3;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vfloat4 a0;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar7 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar42 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar35 = vpcmpeqd_avx(auVar42,(undefined1  [16])valid_i->field_0);
    auVar42 = *(undefined1 (*) [16])(ray + 0x80);
    auVar38 = ZEXT816(0) << 0x40;
    auVar43 = vcmpps_avx(auVar42,auVar38,5);
    auVar43 = vandps_avx(auVar43,auVar35);
    uVar26 = vmovmskps_avx(auVar43);
    if (uVar26 != 0) {
      uVar29 = (ulong)(uVar26 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar35._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar35._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar35._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar35._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar35 = vfmadd231ps_fma(auVar35,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar65 = vfmadd231ps_fma(auVar35,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar35 = vrsqrtps_avx(auVar65);
      fVar72 = auVar35._0_4_;
      fVar76 = auVar35._4_4_;
      fVar77 = auVar35._8_4_;
      fVar78 = auVar35._12_4_;
      auVar64._0_4_ = fVar72 * fVar72 * fVar72 * auVar65._0_4_ * -0.5;
      auVar64._4_4_ = fVar76 * fVar76 * fVar76 * auVar65._4_4_ * -0.5;
      auVar64._8_4_ = fVar77 * fVar77 * fVar77 * auVar65._8_4_ * -0.5;
      auVar64._12_4_ = fVar78 * fVar78 * fVar78 * auVar65._12_4_ * -0.5;
      auVar79._8_4_ = 0x3fc00000;
      auVar79._0_8_ = 0x3fc000003fc00000;
      auVar79._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar79,auVar35,auVar64);
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      do {
        lVar15 = 0;
        for (uVar30 = uVar29; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar30 = (ulong)(uint)((int)lVar15 * 4);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar30 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar30 + 0x50)),0x1c);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + uVar30 + 0x60)),0x28);
        fVar72 = *(float *)((long)pre.ray_space + (uVar30 - 0x10));
        auVar89._0_4_ = auVar35._0_4_ * fVar72;
        auVar89._4_4_ = auVar35._4_4_ * fVar72;
        auVar89._8_4_ = auVar35._8_4_ * fVar72;
        auVar89._12_4_ = auVar35._12_4_ * fVar72;
        auVar64 = vshufpd_avx(auVar89,auVar89,1);
        auVar35 = vmovshdup_avx(auVar89);
        auVar98._0_4_ = auVar35._0_4_ ^ 0x80000000;
        auVar35 = vunpckhps_avx(auVar89,auVar38);
        auVar98._4_12_ = ZEXT812(0) << 0x20;
        auVar94._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
        auVar94._8_8_ = auVar64._8_8_ ^ auVar65._8_8_;
        auVar79 = vinsertps_avx(auVar94,auVar89,0x2a);
        auVar83 = vshufps_avx(auVar35,auVar98,0x41);
        auVar35 = vdpps_avx(auVar79,auVar79,0x7f);
        auVar64 = vdpps_avx(auVar83,auVar83,0x7f);
        auVar35 = vcmpps_avx(auVar35,auVar64,1);
        auVar102._0_4_ = auVar35._0_4_;
        auVar102._4_4_ = auVar102._0_4_;
        auVar102._8_4_ = auVar102._0_4_;
        auVar102._12_4_ = auVar102._0_4_;
        auVar35 = vblendvps_avx(auVar79,auVar83,auVar102);
        auVar64 = vdpps_avx(auVar35,auVar35,0x7f);
        auVar79 = vrsqrtss_avx(auVar64,auVar64);
        fVar76 = auVar79._0_4_;
        fVar76 = fVar76 * 1.5 - auVar64._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
        auVar95._0_4_ = auVar35._0_4_ * fVar76;
        auVar95._4_4_ = auVar35._4_4_ * fVar76;
        auVar95._8_4_ = auVar35._8_4_ * fVar76;
        auVar95._12_4_ = auVar35._12_4_ * fVar76;
        auVar35 = vshufps_avx(auVar95,auVar95,0xc9);
        auVar64 = vshufps_avx(auVar89,auVar89,0xc9);
        auVar103._0_4_ = auVar95._0_4_ * auVar64._0_4_;
        auVar103._4_4_ = auVar95._4_4_ * auVar64._4_4_;
        auVar103._8_4_ = auVar95._8_4_ * auVar64._8_4_;
        auVar103._12_4_ = auVar95._12_4_ * auVar64._12_4_;
        auVar35 = vfmsub231ps_fma(auVar103,auVar89,auVar35);
        auVar79 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar35 = vdpps_avx(auVar79,auVar79,0x7f);
        auVar64 = vrsqrtss_avx(auVar35,auVar35);
        fVar76 = auVar64._0_4_;
        fVar76 = fVar76 * 1.5 - auVar35._0_4_ * 0.5 * fVar76 * fVar76 * fVar76;
        uVar29 = uVar29 - 1 & uVar29;
        auVar99._0_4_ = fVar76 * auVar79._0_4_;
        auVar99._4_4_ = fVar76 * auVar79._4_4_;
        auVar99._8_4_ = fVar76 * auVar79._8_4_;
        auVar99._12_4_ = fVar76 * auVar79._12_4_;
        auVar83._0_4_ = fVar72 * auVar89._0_4_;
        auVar83._4_4_ = fVar72 * auVar89._4_4_;
        auVar83._8_4_ = fVar72 * auVar89._8_4_;
        auVar83._12_4_ = fVar72 * auVar89._12_4_;
        auVar79 = vunpcklps_avx(auVar95,auVar83);
        auVar35 = vunpckhps_avx(auVar95,auVar83);
        auVar83 = vunpcklps_avx(auVar99,auVar38);
        auVar64 = vunpckhps_avx(auVar99,auVar38);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar35,auVar64);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar79,auVar83);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar79,auVar83);
        pre.ray_space[lVar15].vx.field_0 = aVar14;
        pre.ray_space[lVar15].vy.field_0 = aVar12;
        pre.ray_space[lVar15].vz.field_0 = aVar13;
      } while (uVar29 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar84._8_4_ = 0x7fffffff;
      auVar84._0_8_ = 0x7fffffff7fffffff;
      auVar84._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx(auVar84,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar35,auVar90,1);
      auVar38 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar90,auVar35);
      auVar35 = vandps_avx(auVar84,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar35 = vcmpps_avx(auVar35,auVar90,1);
      auVar65 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar90,auVar35);
      auVar35 = vandps_avx(auVar84,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar35 = vcmpps_avx(auVar35,auVar90,1);
      auVar35 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar90,auVar35);
      auVar64 = vrcpps_avx(auVar38);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = &DAT_3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar38 = vfnmadd213ps_fma(auVar38,auVar64,auVar85);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar38,auVar64,auVar64)
      ;
      auVar38 = vrcpps_avx(auVar65);
      auVar65 = vfnmadd213ps_fma(auVar65,auVar38,auVar85);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar65,auVar38,auVar38)
      ;
      auVar38 = vrcpps_avx(auVar35);
      auVar35 = vfnmadd213ps_fma(auVar35,auVar38,auVar85);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar35,auVar38,auVar38)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar38 = ZEXT416(0) << 0x20;
      auVar35 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar38,1);
      auVar57._8_4_ = 0x10;
      auVar57._0_8_ = 0x1000000010;
      auVar57._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar35,auVar57);
      auVar35 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar38,5);
      auVar58._8_4_ = 0x20;
      auVar58._0_8_ = 0x2000000020;
      auVar58._12_4_ = 0x20;
      auVar66._8_4_ = 0x30;
      auVar66._0_8_ = 0x3000000030;
      auVar66._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar66,auVar58,auVar35);
      auVar35 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar38,5);
      auVar44._8_4_ = 0x40;
      auVar44._0_8_ = 0x4000000040;
      auVar44._12_4_ = 0x40;
      auVar49._8_4_ = 0x50;
      auVar49._0_8_ = 0x5000000050;
      auVar49._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar49,auVar44,auVar35);
      auVar35 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar38);
      auVar42 = vmaxps_avx(auVar42,auVar38);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar107 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar35,auVar43);
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar38,auVar42,auVar43);
      auVar42 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar43._0_4_ ^ auVar42._0_4_;
      terminated.field_0._4_4_ = auVar43._4_4_ ^ auVar42._4_4_;
      terminated.field_0._8_4_ = auVar43._8_4_ ^ auVar42._8_4_;
      terminated.field_0._12_4_ = auVar43._12_4_ ^ auVar42._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar32 = &((vfloat<4> *)paVar32)[-1].field_0;
        root.ptr = pNVar33[-1].ptr;
        pNVar33 = pNVar33 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0054b48d:
          iVar28 = 3;
        }
        else {
          aVar3 = *paVar32;
          auVar42 = vcmpps_avx((undefined1  [16])aVar3,(undefined1  [16])tray.tfar.field_0,1);
          uVar27 = vmovmskps_avx(auVar42);
          if (uVar27 == 0) {
            iVar28 = 2;
          }
          else {
            uVar29 = (ulong)(uVar27 & 0xff);
            uVar27 = POPCOUNT(uVar27 & 0xff);
            iVar28 = 0;
            if (uVar27 <= uVar26) {
              do {
                sVar5 = 0;
                for (uVar30 = uVar29; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
                {
                  sVar5 = sVar5 + 1;
                }
                bVar34 = occluded1(This,bvh,root,sVar5,&pre,ray,&tray,context);
                if (bVar34) {
                  terminated.field_0.i[sVar5] = -1;
                }
                uVar29 = uVar29 - 1 & uVar29;
              } while (uVar29 != 0);
              auVar42 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar28 = 3;
              auVar107 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar42[0xf] < '\0') {
                auVar42._8_4_ = 0xff800000;
                auVar42._0_8_ = 0xff800000ff800000;
                auVar42._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar42,
                                   (undefined1  [16])terminated.field_0);
                iVar28 = 2;
              }
            }
            vVar24.field_0 = terminated.field_0;
            auVar108 = ZEXT1664((undefined1  [16])aVar3);
            if (uVar26 < uVar27) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar42 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar108._0_16_,6);
                    if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar42[0xf]) {
                      iVar28 = 2;
                    }
                    else {
                      bVar4 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar6 = This->leafIntersector;
                      local_17c8 = auVar7._0_8_;
                      uStack_17c0 = auVar7._8_8_;
                      valid_o.field_0._0_8_ = local_17c8;
                      valid_o.field_0._8_8_ = uStack_17c0;
                      uVar27 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar27 ^ 0xf) != 0) {
                        uVar29 = (ulong)(byte)(uVar27 ^ 0xf);
                        do {
                          lVar15 = 0;
                          for (uVar30 = uVar29; (uVar30 & 1) == 0;
                              uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                            lVar15 = lVar15 + 1;
                          }
                          cVar25 = (**(code **)((long)pvVar6 + (ulong)bVar4 * 0x40 + 0x18))
                                             (&pre,ray,lVar15,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar25 != '\0') {
                            valid_o.field_0.i[lVar15] = -1;
                          }
                          uVar29 = uVar29 - 1 & uVar29;
                        } while (uVar29 != 0);
                      }
                      auVar17._8_8_ = valid_o.field_0._8_8_;
                      auVar17._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar24.field_0,auVar17);
                      auVar42 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar42[0xf]) {
                        iVar28 = 3;
                      }
                      else {
                        auVar48._8_4_ = 0xff800000;
                        auVar48._0_8_ = 0xff800000ff800000;
                        auVar48._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                                           (undefined1  [16])terminated.field_0);
                        iVar28 = 0;
                      }
                    }
                    auVar107 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                    break;
                  }
                  goto LAB_0054b48d;
                }
                uVar30 = root.ptr & 0xfffffffffffffff0;
                uVar27 = (uint)root.ptr & 7;
                auVar42 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar108._0_16_,6);
                auVar37 = ZEXT1664(auVar42);
                auVar108 = ZEXT1664(auVar107._0_16_);
                uVar29 = 0;
                root.ptr = 8;
                do {
                  sVar5 = *(size_t *)(uVar30 + uVar29 * 8);
                  if (sVar5 != 8) {
                    if ((uVar27 == 6) || (uVar27 == 1)) {
                      uVar31 = *(undefined4 *)(uVar30 + 0x80 + uVar29 * 4);
                      auVar50._4_4_ = uVar31;
                      auVar50._0_4_ = uVar31;
                      auVar50._8_4_ = uVar31;
                      auVar50._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x20 + uVar29 * 4);
                      auVar45._4_4_ = uVar31;
                      auVar45._0_4_ = uVar31;
                      auVar45._8_4_ = uVar31;
                      auVar45._12_4_ = uVar31;
                      auVar42 = *(undefined1 (*) [16])(ray + 0x70);
                      auVar35 = vfmadd231ps_fma(auVar45,auVar42,auVar50);
                      uVar31 = *(undefined4 *)(uVar30 + 0xa0 + uVar29 * 4);
                      auVar51._4_4_ = uVar31;
                      auVar51._0_4_ = uVar31;
                      auVar51._8_4_ = uVar31;
                      auVar51._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x40 + uVar29 * 4);
                      auVar59._4_4_ = uVar31;
                      auVar59._0_4_ = uVar31;
                      auVar59._8_4_ = uVar31;
                      auVar59._12_4_ = uVar31;
                      auVar38 = vfmadd231ps_fma(auVar59,auVar42,auVar51);
                      uVar31 = *(undefined4 *)(uVar30 + 0xc0 + uVar29 * 4);
                      auVar52._4_4_ = uVar31;
                      auVar52._0_4_ = uVar31;
                      auVar52._8_4_ = uVar31;
                      auVar52._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x60 + uVar29 * 4);
                      auVar67._4_4_ = uVar31;
                      auVar67._0_4_ = uVar31;
                      auVar67._8_4_ = uVar31;
                      auVar67._12_4_ = uVar31;
                      auVar65 = vfmadd231ps_fma(auVar67,auVar42,auVar52);
                      uVar31 = *(undefined4 *)(uVar30 + 0x90 + uVar29 * 4);
                      auVar53._4_4_ = uVar31;
                      auVar53._0_4_ = uVar31;
                      auVar53._8_4_ = uVar31;
                      auVar53._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x30 + uVar29 * 4);
                      auVar73._4_4_ = uVar31;
                      auVar73._0_4_ = uVar31;
                      auVar73._8_4_ = uVar31;
                      auVar73._12_4_ = uVar31;
                      auVar64 = vfmadd231ps_fma(auVar73,auVar42,auVar53);
                      uVar31 = *(undefined4 *)(uVar30 + 0xb0 + uVar29 * 4);
                      auVar54._4_4_ = uVar31;
                      auVar54._0_4_ = uVar31;
                      auVar54._8_4_ = uVar31;
                      auVar54._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x50 + uVar29 * 4);
                      auVar80._4_4_ = uVar31;
                      auVar80._0_4_ = uVar31;
                      auVar80._8_4_ = uVar31;
                      auVar80._12_4_ = uVar31;
                      auVar79 = vfmadd231ps_fma(auVar80,auVar42,auVar54);
                      uVar31 = *(undefined4 *)(uVar30 + 0xd0 + uVar29 * 4);
                      auVar55._4_4_ = uVar31;
                      auVar55._0_4_ = uVar31;
                      auVar55._8_4_ = uVar31;
                      auVar55._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x70 + uVar29 * 4);
                      auVar86._4_4_ = uVar31;
                      auVar86._0_4_ = uVar31;
                      auVar86._8_4_ = uVar31;
                      auVar86._12_4_ = uVar31;
                      auVar83 = vfmadd231ps_fma(auVar86,auVar42,auVar55);
                      auVar21._4_4_ = tray.org_rdir.field_0._4_4_;
                      auVar21._0_4_ = tray.org_rdir.field_0._0_4_;
                      auVar21._8_4_ = tray.org_rdir.field_0._8_4_;
                      auVar21._12_4_ = tray.org_rdir.field_0._12_4_;
                      auVar89 = vfmsub213ps_fma(auVar35,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,auVar21)
                      ;
                      auVar22._4_4_ = tray.org_rdir.field_0._20_4_;
                      auVar22._0_4_ = tray.org_rdir.field_0._16_4_;
                      auVar22._8_4_ = tray.org_rdir.field_0._24_4_;
                      auVar22._12_4_ = tray.org_rdir.field_0._28_4_;
                      auVar94 = vfmsub213ps_fma(auVar38,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,auVar22)
                      ;
                      auVar23._4_4_ = tray.org_rdir.field_0._36_4_;
                      auVar23._0_4_ = tray.org_rdir.field_0._32_4_;
                      auVar23._8_4_ = tray.org_rdir.field_0._40_4_;
                      auVar23._12_4_ = tray.org_rdir.field_0._44_4_;
                      auVar95 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,auVar23)
                      ;
                      auVar65 = vfmsub213ps_fma(auVar64,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,auVar21)
                      ;
                      auVar64 = vfmsub213ps_fma(auVar79,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,auVar22)
                      ;
                      auVar79 = vfmsub213ps_fma(auVar83,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,auVar23)
                      ;
                      auVar35 = vpminsd_avx(auVar89,auVar65);
                      auVar38 = vpminsd_avx(auVar94,auVar64);
                      auVar35 = vpmaxsd_avx(auVar35,auVar38);
                      auVar38 = vpminsd_avx(auVar95,auVar79);
                      auVar35 = vpmaxsd_avx(auVar35,auVar38);
                      auVar38 = vpmaxsd_avx(auVar89,auVar65);
                      auVar65 = vpmaxsd_avx(auVar94,auVar64);
                      auVar64 = vpminsd_avx(auVar38,auVar65);
                      auVar38 = vpmaxsd_avx(auVar95,auVar79);
                      auVar65 = vpmaxsd_avx(auVar35,(undefined1  [16])tray.tnear.field_0);
                      auVar38 = vpminsd_avx(auVar64,auVar38);
                      auVar38 = vpminsd_avx(auVar38,(undefined1  [16])tray.tfar.field_0);
                      if (uVar27 == 6) {
                        auVar38 = vcmpps_avx(auVar65,auVar38,2);
                        uVar31 = *(undefined4 *)(uVar30 + 0xe0 + uVar29 * 4);
                        auVar63._4_4_ = uVar31;
                        auVar63._0_4_ = uVar31;
                        auVar63._8_4_ = uVar31;
                        auVar63._12_4_ = uVar31;
                        auVar65 = vcmpps_avx(auVar63,auVar42,2);
                        uVar31 = *(undefined4 *)(uVar30 + 0xf0 + uVar29 * 4);
                        auVar71._4_4_ = uVar31;
                        auVar71._0_4_ = uVar31;
                        auVar71._8_4_ = uVar31;
                        auVar71._12_4_ = uVar31;
                        auVar42 = vcmpps_avx(auVar42,auVar71,1);
                        auVar42 = vandps_avx(auVar65,auVar42);
                        auVar42 = vandps_avx(auVar42,auVar38);
                      }
                      else {
                        auVar42 = vcmpps_avx(auVar65,auVar38,2);
                      }
                    }
                    else {
                      uVar31 = *(undefined4 *)(uVar30 + 0x20 + uVar29 * 4);
                      auVar74._4_4_ = uVar31;
                      auVar74._0_4_ = uVar31;
                      auVar74._8_4_ = uVar31;
                      auVar74._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x30 + uVar29 * 4);
                      auVar68._4_4_ = uVar31;
                      auVar68._0_4_ = uVar31;
                      auVar68._8_4_ = uVar31;
                      auVar68._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x40 + uVar29 * 4);
                      auVar60._4_4_ = uVar31;
                      auVar60._0_4_ = uVar31;
                      auVar60._8_4_ = uVar31;
                      auVar60._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x50 + uVar29 * 4);
                      auVar91._4_4_ = uVar31;
                      auVar91._0_4_ = uVar31;
                      auVar91._8_4_ = uVar31;
                      auVar91._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x60 + uVar29 * 4);
                      auVar87._4_4_ = uVar31;
                      auVar87._0_4_ = uVar31;
                      auVar87._8_4_ = uVar31;
                      auVar87._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0x70 + uVar29 * 4);
                      auVar81._4_4_ = uVar31;
                      auVar81._0_4_ = uVar31;
                      auVar81._8_4_ = uVar31;
                      auVar81._12_4_ = uVar31;
                      fVar72 = *(float *)(uVar30 + 0x80 + uVar29 * 4);
                      auVar96._4_4_ = fVar72;
                      auVar96._0_4_ = fVar72;
                      auVar96._8_4_ = fVar72;
                      auVar96._12_4_ = fVar72;
                      fVar76 = *(float *)(uVar30 + 0x90 + uVar29 * 4);
                      auVar100._4_4_ = fVar76;
                      auVar100._0_4_ = fVar76;
                      auVar100._8_4_ = fVar76;
                      auVar100._12_4_ = fVar76;
                      fVar77 = *(float *)(uVar30 + 0xa0 + uVar29 * 4);
                      auVar104._4_4_ = fVar77;
                      auVar104._0_4_ = fVar77;
                      auVar104._8_4_ = fVar77;
                      auVar104._12_4_ = fVar77;
                      uVar31 = *(undefined4 *)(uVar30 + 0xb0 + uVar29 * 4);
                      auVar56._4_4_ = uVar31;
                      auVar56._0_4_ = uVar31;
                      auVar56._8_4_ = uVar31;
                      auVar56._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0xc0 + uVar29 * 4);
                      auVar46._4_4_ = uVar31;
                      auVar46._0_4_ = uVar31;
                      auVar46._8_4_ = uVar31;
                      auVar46._12_4_ = uVar31;
                      uVar31 = *(undefined4 *)(uVar30 + 0xd0 + uVar29 * 4);
                      auVar39._4_4_ = uVar31;
                      auVar39._0_4_ = uVar31;
                      auVar39._8_4_ = uVar31;
                      auVar39._12_4_ = uVar31;
                      auVar20._4_4_ = tray.org.field_0._36_4_;
                      auVar20._0_4_ = tray.org.field_0._32_4_;
                      auVar20._8_4_ = tray.org.field_0._40_4_;
                      auVar20._12_4_ = tray.org.field_0._44_4_;
                      auVar42 = vfmadd231ps_fma(auVar56,auVar20,auVar96);
                      auVar35 = vfmadd231ps_fma(auVar46,auVar20,auVar100);
                      auVar38 = vfmadd231ps_fma(auVar39,auVar20,auVar104);
                      auVar106._0_4_ = fVar72 * (float)tray.dir.field_0._32_4_;
                      auVar106._4_4_ = fVar72 * (float)tray.dir.field_0._36_4_;
                      auVar106._8_4_ = fVar72 * (float)tray.dir.field_0._40_4_;
                      auVar106._12_4_ = fVar72 * (float)tray.dir.field_0._44_4_;
                      auVar101._0_4_ = fVar76 * (float)tray.dir.field_0._32_4_;
                      auVar101._4_4_ = fVar76 * (float)tray.dir.field_0._36_4_;
                      auVar101._8_4_ = fVar76 * (float)tray.dir.field_0._40_4_;
                      auVar101._12_4_ = fVar76 * (float)tray.dir.field_0._44_4_;
                      auVar97._0_4_ = fVar77 * (float)tray.dir.field_0._32_4_;
                      auVar97._4_4_ = fVar77 * (float)tray.dir.field_0._36_4_;
                      auVar97._8_4_ = fVar77 * (float)tray.dir.field_0._40_4_;
                      auVar97._12_4_ = fVar77 * (float)tray.dir.field_0._44_4_;
                      auVar65 = vfmadd231ps_fma(auVar106,(undefined1  [16])
                                                         tray.dir.field_0.field_0.y.field_0,auVar91)
                      ;
                      auVar64 = vfmadd231ps_fma(auVar101,(undefined1  [16])
                                                         tray.dir.field_0.field_0.y.field_0,auVar87)
                      ;
                      auVar79 = vfmadd231ps_fma(auVar97,auVar81,
                                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0
                                               );
                      auVar19._4_4_ = tray.org.field_0._20_4_;
                      auVar19._0_4_ = tray.org.field_0._16_4_;
                      auVar19._8_4_ = tray.org.field_0._24_4_;
                      auVar19._12_4_ = tray.org.field_0._28_4_;
                      auVar42 = vfmadd231ps_fma(auVar42,auVar19,auVar91);
                      fVar72 = *(float *)(uVar30 + 0xe0 + uVar29 * 4);
                      auVar35 = vfmadd231ps_fma(auVar35,auVar19,auVar87);
                      fVar76 = *(float *)(uVar30 + 0xf0 + uVar29 * 4);
                      auVar38 = vfmadd231ps_fma(auVar38,auVar19,auVar81);
                      fVar77 = *(float *)(uVar30 + 0x100 + uVar29 * 4);
                      auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar74);
                      auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar68);
                      auVar79 = vfmadd231ps_fma(auVar79,auVar60,
                                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0
                                               );
                      auVar18._4_4_ = tray.org.field_0._4_4_;
                      auVar18._0_4_ = tray.org.field_0._0_4_;
                      auVar18._8_4_ = tray.org.field_0._8_4_;
                      auVar18._12_4_ = tray.org.field_0._12_4_;
                      auVar83 = vfmadd231ps_fma(auVar42,auVar18,auVar74);
                      fVar78 = *(float *)(uVar30 + 0x110 + uVar29 * 4);
                      auVar89 = vfmadd231ps_fma(auVar35,auVar18,auVar68);
                      fVar1 = *(float *)(uVar30 + 0x120 + uVar29 * 4);
                      auVar94 = vfmadd231ps_fma(auVar38,auVar18,auVar60);
                      fVar2 = *(float *)(uVar30 + 0x130 + uVar29 * 4);
                      auVar42 = *(undefined1 (*) [16])(ray + 0x70);
                      fVar8 = auVar42._0_4_;
                      auVar92._0_4_ = fVar72 * fVar8;
                      fVar9 = auVar42._4_4_;
                      auVar92._4_4_ = fVar72 * fVar9;
                      fVar10 = auVar42._8_4_;
                      auVar92._8_4_ = fVar72 * fVar10;
                      fVar11 = auVar42._12_4_;
                      auVar92._12_4_ = fVar72 * fVar11;
                      auVar69._0_4_ = fVar76 * fVar8;
                      auVar69._4_4_ = fVar76 * fVar9;
                      auVar69._8_4_ = fVar76 * fVar10;
                      auVar69._12_4_ = fVar76 * fVar11;
                      auVar61._0_4_ = fVar8 * fVar77;
                      auVar61._4_4_ = fVar9 * fVar77;
                      auVar61._8_4_ = fVar10 * fVar77;
                      auVar61._12_4_ = fVar11 * fVar77;
                      auVar40._8_4_ = 0x3f800000;
                      auVar40._0_8_ = &DAT_3f8000003f800000;
                      auVar40._12_4_ = 0x3f800000;
                      auVar42 = vsubps_avx(auVar40,auVar42);
                      auVar35 = ZEXT816(0) << 0x40;
                      auVar95 = vfmadd231ps_fma(auVar92,auVar42,auVar35);
                      auVar98 = vfmadd231ps_fma(auVar69,auVar42,auVar35);
                      auVar99 = vfmadd231ps_fma(auVar61,auVar42,auVar35);
                      fVar72 = auVar42._0_4_;
                      auVar75._0_4_ = fVar72 + fVar8 * fVar78;
                      fVar76 = auVar42._4_4_;
                      auVar75._4_4_ = fVar76 + fVar9 * fVar78;
                      fVar77 = auVar42._8_4_;
                      auVar75._8_4_ = fVar77 + fVar10 * fVar78;
                      fVar105 = auVar42._12_4_;
                      auVar75._12_4_ = fVar105 + fVar11 * fVar78;
                      auVar82._0_4_ = fVar72 + fVar8 * fVar1;
                      auVar82._4_4_ = fVar76 + fVar9 * fVar1;
                      auVar82._8_4_ = fVar77 + fVar10 * fVar1;
                      auVar82._12_4_ = fVar105 + fVar11 * fVar1;
                      auVar42 = vandps_avx(auVar65,auVar84);
                      auVar36._8_4_ = 0x219392ef;
                      auVar36._0_8_ = 0x219392ef219392ef;
                      auVar36._12_4_ = 0x219392ef;
                      auVar42 = vcmpps_avx(auVar42,auVar36,1);
                      auVar35 = vblendvps_avx(auVar65,auVar36,auVar42);
                      auVar42 = vandps_avx(auVar64,auVar84);
                      auVar42 = vcmpps_avx(auVar42,auVar36,1);
                      auVar38 = vblendvps_avx(auVar64,auVar36,auVar42);
                      auVar42 = vandps_avx(auVar79,auVar84);
                      auVar108 = ZEXT1664(auVar108._0_16_);
                      auVar42 = vcmpps_avx(auVar42,auVar36,1);
                      auVar42 = vblendvps_avx(auVar79,auVar36,auVar42);
                      auVar37 = ZEXT1664(auVar37._0_16_);
                      auVar65 = vrcpps_avx(auVar35);
                      auVar35 = vfnmadd213ps_fma(auVar35,auVar65,auVar40);
                      auVar65 = vfmadd132ps_fma(auVar35,auVar65,auVar65);
                      auVar35 = vrcpps_avx(auVar38);
                      auVar38 = vfnmadd213ps_fma(auVar38,auVar35,auVar40);
                      auVar38 = vfmadd132ps_fma(auVar38,auVar35,auVar35);
                      auVar35 = vrcpps_avx(auVar42);
                      auVar42 = vfnmadd213ps_fma(auVar42,auVar35,auVar40);
                      auVar64 = vfmadd132ps_fma(auVar42,auVar35,auVar35);
                      auVar42 = vsubps_avx(auVar95,auVar83);
                      auVar35 = vsubps_avx(auVar75,auVar83);
                      auVar107 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar93._0_4_ = auVar65._0_4_ * auVar42._0_4_;
                      auVar93._4_4_ = auVar65._4_4_ * auVar42._4_4_;
                      auVar93._8_4_ = auVar65._8_4_ * auVar42._8_4_;
                      auVar93._12_4_ = auVar65._12_4_ * auVar42._12_4_;
                      auVar88._0_4_ = auVar65._0_4_ * auVar35._0_4_;
                      auVar88._4_4_ = auVar65._4_4_ * auVar35._4_4_;
                      auVar88._8_4_ = auVar65._8_4_ * auVar35._8_4_;
                      auVar88._12_4_ = auVar65._12_4_ * auVar35._12_4_;
                      auVar42 = vsubps_avx(auVar98,auVar89);
                      auVar35 = vsubps_avx(auVar82,auVar89);
                      auVar70._0_4_ = auVar38._0_4_ * auVar42._0_4_;
                      auVar70._4_4_ = auVar38._4_4_ * auVar42._4_4_;
                      auVar70._8_4_ = auVar38._8_4_ * auVar42._8_4_;
                      auVar70._12_4_ = auVar38._12_4_ * auVar42._12_4_;
                      auVar47._0_4_ = auVar38._0_4_ * auVar35._0_4_;
                      auVar47._4_4_ = auVar38._4_4_ * auVar35._4_4_;
                      auVar47._8_4_ = auVar38._8_4_ * auVar35._8_4_;
                      auVar47._12_4_ = auVar38._12_4_ * auVar35._12_4_;
                      auVar42 = vsubps_avx(auVar99,auVar94);
                      auVar62._0_4_ = auVar64._0_4_ * auVar42._0_4_;
                      auVar62._4_4_ = auVar64._4_4_ * auVar42._4_4_;
                      auVar62._8_4_ = auVar64._8_4_ * auVar42._8_4_;
                      auVar62._12_4_ = auVar64._12_4_ * auVar42._12_4_;
                      auVar16._4_4_ = fVar76 + fVar9 * fVar2;
                      auVar16._0_4_ = fVar72 + fVar8 * fVar2;
                      auVar16._8_4_ = fVar77 + fVar10 * fVar2;
                      auVar16._12_4_ = fVar105 + fVar11 * fVar2;
                      auVar42 = vsubps_avx(auVar16,auVar94);
                      auVar41._0_4_ = auVar64._0_4_ * auVar42._0_4_;
                      auVar41._4_4_ = auVar64._4_4_ * auVar42._4_4_;
                      auVar41._8_4_ = auVar64._8_4_ * auVar42._8_4_;
                      auVar41._12_4_ = auVar64._12_4_ * auVar42._12_4_;
                      auVar42 = vpminsd_avx(auVar93,auVar88);
                      auVar35 = vpminsd_avx(auVar70,auVar47);
                      auVar42 = vpmaxsd_avx(auVar42,auVar35);
                      auVar35 = vpminsd_avx(auVar62,auVar41);
                      auVar35 = vpmaxsd_avx(auVar42,auVar35);
                      auVar42 = vpmaxsd_avx(auVar93,auVar88);
                      auVar38 = vpmaxsd_avx(auVar70,auVar47);
                      auVar65 = vpminsd_avx(auVar42,auVar38);
                      auVar42 = vpmaxsd_avx(auVar62,auVar41);
                      auVar38 = vpmaxsd_avx(auVar35,(undefined1  [16])tray.tnear.field_0);
                      auVar42 = vpminsd_avx(auVar65,auVar42);
                      auVar42 = vpminsd_avx(auVar42,(undefined1  [16])tray.tfar.field_0);
                      auVar42 = vcmpps_avx(auVar38,auVar42,2);
                    }
                    auVar42 = vandps_avx(auVar42,auVar37._0_16_);
                    auVar42 = vpslld_avx(auVar42,0x1f);
                    if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar42[0xf] < '\0') {
                      auVar42 = vblendvps_avx(auVar107._0_16_,auVar35,auVar42);
                      if (root.ptr != 8) {
                        pNVar33->ptr = root.ptr;
                        pNVar33 = pNVar33 + 1;
                        *paVar32 = auVar108._0_16_;
                        paVar32 = paVar32 + 1;
                      }
                      auVar108 = ZEXT1664(auVar42);
                      root.ptr = sVar5;
                    }
                  }
                } while ((sVar5 != 8) && (bVar34 = uVar29 < 3, uVar29 = uVar29 + 1, bVar34));
                iVar28 = 0;
                if (root.ptr == 8) {
LAB_0054b35e:
                  bVar34 = false;
                  iVar28 = 4;
                }
                else {
                  auVar42 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar108._0_16_,6);
                  uVar31 = vmovmskps_avx(auVar42);
                  bVar34 = true;
                  if ((uint)POPCOUNT(uVar31) <= uVar26) {
                    pNVar33->ptr = root.ptr;
                    pNVar33 = pNVar33 + 1;
                    *paVar32 = auVar108._0_16_;
                    paVar32 = paVar32 + 1;
                    goto LAB_0054b35e;
                  }
                }
              } while (bVar34);
            }
          }
        }
      } while (iVar28 != 3);
      auVar7 = vandps_avx(auVar43,(undefined1  [16])terminated.field_0);
      auVar43._8_4_ = 0xff800000;
      auVar43._0_8_ = 0xff800000ff800000;
      auVar43._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar43);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }